

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (book->used_entries < 1) {
    if (0 < n) {
      memset(a,0,(ulong)(uint)n << 2);
    }
  }
  else if (0 < n) {
    lVar7 = 0;
    do {
      lVar4 = decode_packed_entry_number(book,b);
      if ((int)lVar4 == -1) {
        return -1;
      }
      if ((int)lVar7 < n) {
        lVar2 = book->dim;
        pfVar3 = book->valuelist;
        lVar7 = (long)(int)lVar7;
        lVar5 = lVar2;
        if (lVar2 < 1) {
          lVar5 = 0;
        }
        lVar6 = 0;
        do {
          if (lVar5 == lVar6) {
            lVar7 = lVar7 + lVar6;
            goto LAB_001d9470;
          }
          lVar1 = lVar6 + 1;
          a[lVar7 + lVar6] = pfVar3[(int)lVar4 * lVar2 + lVar6];
          lVar6 = lVar1;
        } while ((ulong)(uint)n - lVar7 != lVar1);
        lVar7 = lVar7 + lVar1;
      }
LAB_001d9470:
    } while ((int)lVar7 < n);
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int i,j,entry;
    float *t;

    for(i=0;i<n;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      t     = book->valuelist+entry*book->dim;
      for (j=0;i<n && j<book->dim;){
        a[i++]=t[j++];
      }
    }
  }else{
    int i;

    for(i=0;i<n;){
      a[i++]=0.f;
    }
  }
  return(0);
}